

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.c
# Opt level: O1

void WebRtcIsac_Time2Spec
               (TransformTables *tables,double *inre1,double *inre2,int16_t *outreQ7,
               int16_t *outimQ7,FFTstr *fftstr_obj)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  int dims [1];
  double tmpim [240];
  double tmpre [240];
  int local_f54;
  double local_f50;
  double local_f48;
  double local_f40;
  double local_f38;
  undefined8 uStack_f30;
  double local_f28 [240];
  double local_7a8 [240];
  
  local_f54 = 0xf0;
  lVar5 = 0;
  do {
    dVar1 = *(double *)((long)tables->costab1 + lVar5);
    dVar2 = *(double *)((long)tables->sintab1 + lVar5);
    dVar3 = *(double *)((long)inre1 + lVar5);
    dVar4 = *(double *)((long)inre2 + lVar5);
    *(double *)((long)local_7a8 + lVar5) = (dVar3 * dVar1 + dVar2 * dVar4) * 0.03227486121839514;
    *(double *)((long)local_f28 + lVar5) = (dVar4 * dVar1 - dVar2 * dVar3) * 0.03227486121839514;
    lVar5 = lVar5 + 8;
  } while (lVar5 != 0x780);
  WebRtcIsac_Fftns(1,&local_f54,local_7a8,local_f28,-1,1.0,fftstr_obj);
  lVar5 = 0x1de;
  lVar7 = 0;
  do {
    dVar1 = *(double *)((long)local_7a8 + lVar7 * 4);
    local_f50 = *(double *)((long)local_7a8 + lVar5 * 4);
    local_f40 = dVar1 + local_f50;
    local_f50 = local_f50 - dVar1;
    local_f38 = *(double *)((long)local_f28 + lVar7 * 4);
    dVar1 = *(double *)((long)local_f28 + lVar5 * 4);
    local_f48 = local_f38 - dVar1;
    local_f38 = local_f38 + dVar1;
    uStack_f30 = 0;
    dVar1 = *(double *)((long)tables->costab2 + lVar7 * 4);
    dVar2 = *(double *)((long)tables->sintab2 + lVar7 * 4);
    lVar6 = lrint((local_f40 * dVar1 - dVar2 * local_f48) * 128.0);
    *(short *)((long)outreQ7 + lVar7) = (short)lVar6;
    lVar6 = lrint((local_f40 * dVar2 + local_f48 * dVar1) * 128.0);
    *(short *)((long)outimQ7 + lVar7) = (short)lVar6;
    lVar6 = lrint((-local_f38 * dVar2 - dVar1 * local_f50) * 128.0);
    *(short *)((long)outreQ7 + lVar5) = (short)lVar6;
    lVar6 = lrint((local_f50 * dVar2 - local_f38 * dVar1) * 128.0);
    *(short *)((long)outimQ7 + lVar5) = (short)lVar6;
    lVar5 = lVar5 + -2;
    lVar7 = lVar7 + 2;
  } while (lVar7 != 0xf0);
  return;
}

Assistant:

void WebRtcIsac_Time2Spec(const TransformTables* tables,
                          double* inre1,
                          double* inre2,
                          int16_t* outreQ7,
                          int16_t* outimQ7,
                          FFTstr* fftstr_obj) {
  int k;
  int dims[1];
  double tmp1r, tmp1i, xr, xi, yr, yi, fact;
  double tmpre[FRAMESAMPLES_HALF], tmpim[FRAMESAMPLES_HALF];


  dims[0] = FRAMESAMPLES_HALF;


  /* Multiply with complex exponentials and combine into one complex vector */
  fact = 0.5 / sqrt(FRAMESAMPLES_HALF);
  for (k = 0; k < FRAMESAMPLES_HALF; k++) {
    tmp1r = tables->costab1[k];
    tmp1i = tables->sintab1[k];
    tmpre[k] = (inre1[k] * tmp1r + inre2[k] * tmp1i) * fact;
    tmpim[k] = (inre2[k] * tmp1r - inre1[k] * tmp1i) * fact;
  }


  /* Get DFT */
  WebRtcIsac_Fftns(1, dims, tmpre, tmpim, -1, 1.0, fftstr_obj);

  /* Use symmetry to separate into two complex vectors and center frames in time around zero */
  for (k = 0; k < FRAMESAMPLES_QUARTER; k++) {
    xr = tmpre[k] + tmpre[FRAMESAMPLES_HALF - 1 - k];
    yi = -tmpre[k] + tmpre[FRAMESAMPLES_HALF - 1 - k];
    xi = tmpim[k] - tmpim[FRAMESAMPLES_HALF - 1 - k];
    yr = tmpim[k] + tmpim[FRAMESAMPLES_HALF - 1 - k];

    tmp1r = tables->costab2[k];
    tmp1i = tables->sintab2[k];
    outreQ7[k] = (int16_t)WebRtcIsac_lrint((xr * tmp1r - xi * tmp1i) * 128.0);
    outimQ7[k] = (int16_t)WebRtcIsac_lrint((xr * tmp1i + xi * tmp1r) * 128.0);
    outreQ7[FRAMESAMPLES_HALF - 1 - k] = (int16_t)WebRtcIsac_lrint((-yr * tmp1i - yi * tmp1r) * 128.0);
    outimQ7[FRAMESAMPLES_HALF - 1 - k] = (int16_t)WebRtcIsac_lrint((-yr * tmp1r + yi * tmp1i) * 128.0);
  }
}